

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O3

char * __thiscall bloaty::Options::_InternalParse(Options *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  Arena *pAVar3;
  ArenaStringPtr *pAVar4;
  ArenaStringPtr *pAVar5;
  bool bVar6;
  string *psVar7;
  CustomDataSource *msg;
  Rep *pRVar8;
  ulong uVar9;
  uint *field_name;
  char *pcVar10;
  char cVar11;
  uint uVar12;
  char *pcVar13;
  int iVar14;
  byte *pbVar15;
  internal *piVar16;
  byte *pbVar17;
  pair<const_char_*,_unsigned_int> pVar18;
  pair<const_char_*,_unsigned_long> pVar19;
  StringPiece str;
  StringPiece str_00;
  StringPiece str_01;
  StringPiece str_02;
  StringPiece str_03;
  StringPiece str_04;
  byte *local_80;
  uint local_74;
  InternalMetadataWithArena *local_70;
  RepeatedPtrFieldBase *local_68;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_80 = (byte *)ptr;
  bVar6 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_80,ctx->group_depth_);
  local_74 = 0;
  if (!bVar6) {
    local_50 = &(this->source_map_).super_RepeatedPtrFieldBase;
    local_40 = &this->source_filter_;
    local_58 = &(this->debug_filename_).super_RepeatedPtrFieldBase;
    local_48 = &this->disassemble_function_;
    local_38 = &(this->custom_data_source_).super_RepeatedPtrFieldBase;
    local_70 = &this->_internal_metadata_;
    local_60 = &(this->data_source_).super_RepeatedPtrFieldBase;
    local_68 = &(this->base_filename_).super_RepeatedPtrFieldBase;
    local_74 = 0;
    do {
      bVar1 = *local_80;
      uVar9 = (ulong)bVar1;
      pbVar15 = local_80 + 1;
      if ((char)bVar1 < '\0') {
        uVar12 = ((uint)bVar1 + (uint)*pbVar15 * 0x80) - 0x80;
        uVar9 = (ulong)uVar12;
        if (-1 < (char)*pbVar15) {
          pbVar15 = local_80 + 2;
          goto LAB_0018eb8e;
        }
        pVar18 = google::protobuf::internal::ReadTagFallback((char *)local_80,uVar12);
        local_80 = (byte *)pVar18.first;
        if (local_80 != (byte *)0x0) goto LAB_0018eb93;
LAB_0018f755:
        local_80 = (byte *)0x0;
        break;
      }
LAB_0018eb8e:
      pVar18._8_8_ = uVar9;
      pVar18.first = (char *)pbVar15;
      local_80 = pbVar15;
LAB_0018eb93:
      pAVar5 = local_40;
      pAVar4 = local_48;
      pbVar15 = (byte *)pVar18.first;
      uVar12 = pVar18.second;
      field_name = &switchD_0018ebb1::switchdataD_00334260;
      cVar11 = (char)pVar18.second;
      switch((uint)(pVar18._8_8_ >> 3) & 0x1fffffff) {
      case 1:
        if (cVar11 != '\n') break;
        pbVar15 = pbVar15 + -1;
        do {
          local_80 = pbVar15 + 1;
          pRVar8 = (this->filename_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar8 == (Rep *)0x0) {
            iVar14 = (this->filename_).super_RepeatedPtrFieldBase.total_size_;
LAB_0018ebf4:
            google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                      (&(this->filename_).super_RepeatedPtrFieldBase,iVar14 + 1);
            pRVar8 = (this->filename_).super_RepeatedPtrFieldBase.rep_;
            iVar14 = pRVar8->allocated_size;
LAB_0018ec04:
            pRVar8->allocated_size = iVar14 + 1;
            pAVar3 = (this->filename_).super_RepeatedPtrFieldBase.arena_;
            if (pAVar3 == (Arena *)0x0) {
              psVar7 = (string *)operator_new(0x20);
            }
            else {
              if (pAVar3->hooks_cookie_ != (void *)0x0) {
                google::protobuf::Arena::OnArenaAllocation
                          (pAVar3,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              }
              psVar7 = (string *)
                       google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                 (&pAVar3->impl_,0x20,
                                  google::protobuf::internal::
                                  arena_destruct_object<std::__cxx11::string>);
            }
            (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
            psVar7->_M_string_length = 0;
            (psVar7->field_2)._M_local_buf[0] = '\0';
            pRVar8 = (this->filename_).super_RepeatedPtrFieldBase.rep_;
            iVar14 = (this->filename_).super_RepeatedPtrFieldBase.current_size_;
            pcVar10 = (char *)(long)iVar14;
            (this->filename_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
            pRVar8->elements[(long)pcVar10] = psVar7;
          }
          else {
            iVar2 = (this->filename_).super_RepeatedPtrFieldBase.current_size_;
            pcVar10 = (char *)(long)iVar2;
            iVar14 = pRVar8->allocated_size;
            if (iVar14 <= iVar2) {
              if (iVar14 == (this->filename_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0018ebf4;
              goto LAB_0018ec04;
            }
            (this->filename_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            psVar7 = (string *)pRVar8->elements[(long)pcVar10];
          }
          pbVar15 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                      (psVar7,(char *)local_80,ctx);
          piVar16 = (internal *)(psVar7->_M_dataplus)._M_p;
          pcVar13 = (char *)psVar7->_M_string_length;
          if ((long)pcVar13 < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig
                      ((size_t)pcVar13,"size_t to int conversion");
          }
          str.length_ = (stringpiece_ssize_type)"bloaty.Options.filename";
          str.ptr_ = pcVar13;
          google::protobuf::internal::VerifyUTF8(piVar16,str,pcVar10);
          if (pbVar15 == (byte *)0x0) goto LAB_0018f755;
          local_80 = pbVar15;
        } while ((pbVar15 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar15 == 10));
        goto LAB_0018f667;
      case 2:
        if (cVar11 == '\x12') {
          pbVar15 = pbVar15 + -1;
          do {
            local_80 = pbVar15 + 1;
            pRVar8 = (this->base_filename_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar8 == (Rep *)0x0) {
              iVar14 = (this->base_filename_).super_RepeatedPtrFieldBase.total_size_;
LAB_0018f371:
              google::protobuf::internal::RepeatedPtrFieldBase::Reserve(local_68,iVar14 + 1);
              pRVar8 = (this->base_filename_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = pRVar8->allocated_size;
LAB_0018f383:
              pRVar8->allocated_size = iVar14 + 1;
              pAVar3 = ((RepeatedPtrFieldBase *)&local_68->arena_)->arena_;
              if (pAVar3 == (Arena *)0x0) {
                psVar7 = (string *)operator_new(0x20);
              }
              else {
                if (pAVar3->hooks_cookie_ != (void *)0x0) {
                  google::protobuf::Arena::OnArenaAllocation
                            (pAVar3,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                }
                psVar7 = (string *)
                         google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                   (&pAVar3->impl_,0x20,
                                    google::protobuf::internal::
                                    arena_destruct_object<std::__cxx11::string>);
              }
              (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
              psVar7->_M_string_length = 0;
              (psVar7->field_2)._M_local_buf[0] = '\0';
              pRVar8 = (this->base_filename_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = (this->base_filename_).super_RepeatedPtrFieldBase.current_size_;
              pcVar10 = (char *)(long)iVar14;
              (this->base_filename_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
              pRVar8->elements[(long)pcVar10] = psVar7;
            }
            else {
              iVar2 = (this->base_filename_).super_RepeatedPtrFieldBase.current_size_;
              pcVar10 = (char *)(long)iVar2;
              iVar14 = pRVar8->allocated_size;
              if (iVar14 <= iVar2) {
                if (iVar14 == (this->base_filename_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_0018f371;
                goto LAB_0018f383;
              }
              (this->base_filename_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              psVar7 = (string *)pRVar8->elements[(long)pcVar10];
            }
            pbVar15 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                        (psVar7,(char *)local_80,ctx);
            piVar16 = (internal *)(psVar7->_M_dataplus)._M_p;
            pcVar13 = (char *)psVar7->_M_string_length;
            if ((long)pcVar13 < 0) {
              google::protobuf::StringPiece::LogFatalSizeTooBig
                        ((size_t)pcVar13,"size_t to int conversion");
            }
            str_03.length_ = (stringpiece_ssize_type)"bloaty.Options.base_filename";
            str_03.ptr_ = pcVar13;
            google::protobuf::internal::VerifyUTF8(piVar16,str_03,pcVar10);
            if (pbVar15 == (byte *)0x0) goto LAB_0018f755;
            local_80 = pbVar15;
          } while ((pbVar15 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar15 == 0x12));
          goto LAB_0018f667;
        }
        break;
      case 3:
        if (cVar11 == '\x1a') {
          pbVar15 = pbVar15 + -1;
          do {
            local_80 = pbVar15 + 1;
            pRVar8 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar8 == (Rep *)0x0) {
              iVar14 = (this->data_source_).super_RepeatedPtrFieldBase.total_size_;
LAB_0018f12c:
              google::protobuf::internal::RepeatedPtrFieldBase::Reserve(local_60,iVar14 + 1);
              pRVar8 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = pRVar8->allocated_size;
LAB_0018f13e:
              pRVar8->allocated_size = iVar14 + 1;
              pAVar3 = ((RepeatedPtrFieldBase *)&local_60->arena_)->arena_;
              if (pAVar3 == (Arena *)0x0) {
                psVar7 = (string *)operator_new(0x20);
              }
              else {
                if (pAVar3->hooks_cookie_ != (void *)0x0) {
                  google::protobuf::Arena::OnArenaAllocation
                            (pAVar3,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                }
                psVar7 = (string *)
                         google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                   (&pAVar3->impl_,0x20,
                                    google::protobuf::internal::
                                    arena_destruct_object<std::__cxx11::string>);
              }
              (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
              psVar7->_M_string_length = 0;
              (psVar7->field_2)._M_local_buf[0] = '\0';
              pRVar8 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
              pcVar10 = (char *)(long)iVar14;
              (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
              pRVar8->elements[(long)pcVar10] = psVar7;
            }
            else {
              iVar2 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
              pcVar10 = (char *)(long)iVar2;
              iVar14 = pRVar8->allocated_size;
              if (iVar14 <= iVar2) {
                if (iVar14 == (this->data_source_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_0018f12c;
                goto LAB_0018f13e;
              }
              (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              psVar7 = (string *)pRVar8->elements[(long)pcVar10];
            }
            pbVar15 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                        (psVar7,(char *)local_80,ctx);
            piVar16 = (internal *)(psVar7->_M_dataplus)._M_p;
            pcVar13 = (char *)psVar7->_M_string_length;
            if ((long)pcVar13 < 0) {
              google::protobuf::StringPiece::LogFatalSizeTooBig
                        ((size_t)pcVar13,"size_t to int conversion");
            }
            str_02.length_ = (stringpiece_ssize_type)"bloaty.Options.data_source";
            str_02.ptr_ = pcVar13;
            google::protobuf::internal::VerifyUTF8(piVar16,str_02,pcVar10);
            if (pbVar15 == (byte *)0x0) goto LAB_0018f755;
            local_80 = pbVar15;
          } while ((pbVar15 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar15 == 0x1a));
          goto LAB_0018f667;
        }
        break;
      case 4:
        if (cVar11 == ' ') {
          local_74 = local_74 | 0x100;
          uVar9 = (ulong)(char)*pbVar15;
          pbVar17 = pbVar15 + 1;
          if ((long)uVar9 < 0) {
            uVar12 = ((uint)*pbVar15 + (uint)*pbVar17 * 0x80) - 0x80;
            if ((char)*pbVar17 < '\0') {
              pVar19 = google::protobuf::internal::VarintParseSlow64((char *)pbVar15,uVar12);
              pbVar15 = (byte *)pVar19.first;
              this->max_rows_per_level_ = pVar19.second;
              goto joined_r0x0018f62a;
            }
            uVar9 = (ulong)uVar12;
            pbVar17 = pbVar15 + 2;
          }
          this->max_rows_per_level_ = uVar9;
          local_80 = pbVar17;
          goto LAB_0018f667;
        }
        break;
      case 5:
        if (cVar11 == '(') {
          uVar9 = (ulong)(char)*pbVar15;
          pbVar17 = pbVar15 + 1;
          if ((long)uVar9 < 0) {
            uVar12 = ((uint)*pbVar15 + (uint)*pbVar17 * 0x80) - 0x80;
            if (-1 < (char)*pbVar17) {
              uVar9 = (ulong)uVar12;
              pbVar17 = pbVar15 + 2;
              goto LAB_0018eeee;
            }
            pVar19 = google::protobuf::internal::VarintParseSlow64((char *)pbVar15,uVar12);
            uVar12 = (uint)pVar19.second;
            local_80 = (byte *)pVar19.first;
            if (local_80 == (byte *)0x0) goto LAB_0018f755;
          }
          else {
LAB_0018eeee:
            uVar12 = (uint)uVar9;
            local_80 = pbVar17;
          }
          if (uVar12 < 3) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
            this->demangle_ = uVar12;
          }
          else {
            _InternalParse();
          }
          goto LAB_0018f667;
        }
        break;
      case 6:
        if (cVar11 == '0') {
          uVar9 = (ulong)(char)*pbVar15;
          pbVar17 = pbVar15 + 1;
          if ((long)uVar9 < 0) {
            uVar12 = ((uint)*pbVar15 + (uint)*pbVar17 * 0x80) - 0x80;
            if (-1 < (char)*pbVar17) {
              uVar9 = (ulong)uVar12;
              pbVar17 = pbVar15 + 2;
              goto LAB_0018f4a1;
            }
            pVar19 = google::protobuf::internal::VarintParseSlow64((char *)pbVar15,uVar12);
            uVar12 = (uint)pVar19.second;
            local_80 = (byte *)pVar19.first;
            if (local_80 == (byte *)0x0) goto LAB_0018f755;
          }
          else {
LAB_0018f4a1:
            uVar12 = (uint)uVar9;
            local_80 = pbVar17;
          }
          if (uVar12 < 3) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
            this->sort_by_ = uVar12;
          }
          else {
            _InternalParse();
          }
          goto LAB_0018f667;
        }
        break;
      case 7:
        if (cVar11 == '8') {
          local_74 = local_74 | 0x10;
          bVar1 = *pbVar15;
          uVar12 = (uint)bVar1;
          pbVar17 = pbVar15 + 1;
          if ((char)bVar1 < '\0') {
            uVar12 = ((uint)bVar1 + (uint)*pbVar17 * 0x80) - 0x80;
            if ((char)*pbVar17 < '\0') {
              pVar19 = google::protobuf::internal::VarintParseSlow64((char *)pbVar15,uVar12);
              pbVar15 = (byte *)pVar19.first;
              this->verbose_level_ = (int32)pVar19.second;
              goto joined_r0x0018f62a;
            }
            pbVar17 = pbVar15 + 2;
          }
          this->verbose_level_ = uVar12;
          local_80 = pbVar17;
          goto LAB_0018f667;
        }
        break;
      case 8:
        if (cVar11 == 'B') {
          local_80 = pbVar15 + -1;
          do {
            local_80 = local_80 + 1;
            pRVar8 = (this->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar8 == (Rep *)0x0) {
              iVar14 = (this->custom_data_source_).super_RepeatedPtrFieldBase.total_size_;
LAB_0018f295:
              google::protobuf::internal::RepeatedPtrFieldBase::Reserve(local_38,iVar14 + 1);
              pRVar8 = (this->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = pRVar8->allocated_size;
LAB_0018f2a7:
              pRVar8->allocated_size = iVar14 + 1;
              msg = google::protobuf::Arena::CreateMaybeMessage<bloaty::CustomDataSource>
                              ((this->custom_data_source_).super_RepeatedPtrFieldBase.arena_);
              pRVar8 = (this->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
              (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
              pRVar8->elements[iVar14] = msg;
            }
            else {
              iVar2 = (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
              iVar14 = pRVar8->allocated_size;
              if (iVar14 <= iVar2) {
                if (iVar14 == (this->custom_data_source_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_0018f295;
                goto LAB_0018f2a7;
              }
              (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg = (CustomDataSource *)pRVar8->elements[iVar2];
            }
            local_80 = (byte *)google::protobuf::internal::ParseContext::
                               ParseMessage<bloaty::CustomDataSource>(ctx,msg,(char *)local_80);
            if (local_80 == (byte *)0x0) goto LAB_0018f755;
          } while ((local_80 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_80 == 0x42));
          goto LAB_0018f667;
        }
        break;
      case 9:
        if (cVar11 != 'J') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        psVar7 = (this->disassemble_function_).ptr_;
        if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_48,(string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar7 = pAVar4->ptr_;
          pbVar15 = local_80;
        }
        pbVar15 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                    (psVar7,(char *)pbVar15,ctx);
        piVar16 = (internal *)(psVar7->_M_dataplus)._M_p;
        pcVar10 = (char *)psVar7->_M_string_length;
        if ((long)pcVar10 < 0) {
          google::protobuf::StringPiece::LogFatalSizeTooBig
                    ((size_t)pcVar10,"size_t to int conversion");
        }
        pcVar13 = "bloaty.Options.disassemble_function";
LAB_0018f61d:
        str_04.length_ = (stringpiece_ssize_type)pcVar13;
        str_04.ptr_ = pcVar10;
        google::protobuf::internal::VerifyUTF8(piVar16,str_04,(char *)field_name);
        goto joined_r0x0018f62a;
      case 10:
        if (cVar11 == 'R') {
          pbVar15 = pbVar15 + -1;
          do {
            local_80 = pbVar15 + 1;
            pRVar8 = (this->debug_filename_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar8 == (Rep *)0x0) {
              iVar14 = (this->debug_filename_).super_RepeatedPtrFieldBase.total_size_;
LAB_0018efde:
              google::protobuf::internal::RepeatedPtrFieldBase::Reserve(local_58,iVar14 + 1);
              pRVar8 = (this->debug_filename_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = pRVar8->allocated_size;
LAB_0018eff3:
              pRVar8->allocated_size = iVar14 + 1;
              pAVar3 = ((RepeatedPtrFieldBase *)&local_58->arena_)->arena_;
              if (pAVar3 == (Arena *)0x0) {
                psVar7 = (string *)operator_new(0x20);
              }
              else {
                if (pAVar3->hooks_cookie_ != (void *)0x0) {
                  google::protobuf::Arena::OnArenaAllocation
                            (pAVar3,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                }
                psVar7 = (string *)
                         google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                   (&pAVar3->impl_,0x20,
                                    google::protobuf::internal::
                                    arena_destruct_object<std::__cxx11::string>);
              }
              (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
              psVar7->_M_string_length = 0;
              (psVar7->field_2)._M_local_buf[0] = '\0';
              pRVar8 = (this->debug_filename_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
              pcVar10 = (char *)(long)iVar14;
              (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
              pRVar8->elements[(long)pcVar10] = psVar7;
            }
            else {
              iVar2 = (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
              pcVar10 = (char *)(long)iVar2;
              iVar14 = pRVar8->allocated_size;
              if (iVar14 <= iVar2) {
                if (iVar14 == (this->debug_filename_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_0018efde;
                goto LAB_0018eff3;
              }
              (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              psVar7 = (string *)pRVar8->elements[(long)pcVar10];
            }
            pbVar15 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                        (psVar7,(char *)local_80,ctx);
            piVar16 = (internal *)(psVar7->_M_dataplus)._M_p;
            pcVar13 = (char *)psVar7->_M_string_length;
            if ((long)pcVar13 < 0) {
              google::protobuf::StringPiece::LogFatalSizeTooBig
                        ((size_t)pcVar13,"size_t to int conversion");
            }
            str_01.length_ = (stringpiece_ssize_type)"bloaty.Options.debug_filename";
            str_01.ptr_ = pcVar13;
            google::protobuf::internal::VerifyUTF8(piVar16,str_01,pcVar10);
            if (pbVar15 == (byte *)0x0) goto LAB_0018f755;
            local_80 = pbVar15;
          } while ((pbVar15 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar15 == 0x52));
          goto LAB_0018f667;
        }
        break;
      case 0xb:
        if (cVar11 == 'X') {
          local_74 = local_74 | 0x40;
          uVar9 = (ulong)(char)*pbVar15;
          pbVar17 = pbVar15 + 1;
          if ((long)uVar9 < 0) {
            uVar12 = ((uint)*pbVar15 + (uint)*pbVar17 * 0x80) - 0x80;
            if ((char)*pbVar17 < '\0') {
              pVar19 = google::protobuf::internal::VarintParseSlow64((char *)pbVar15,uVar12);
              pbVar15 = (byte *)pVar19.first;
              this->debug_vmaddr_ = pVar19.second;
              goto joined_r0x0018f62a;
            }
            uVar9 = (ulong)uVar12;
            pbVar17 = pbVar15 + 2;
          }
          this->debug_vmaddr_ = uVar9;
          local_80 = pbVar17;
          goto LAB_0018f667;
        }
        break;
      case 0xc:
        if (cVar11 == '`') {
          local_74 = local_74 | 0x80;
          uVar9 = (ulong)(char)*pbVar15;
          pbVar17 = pbVar15 + 1;
          if ((long)uVar9 < 0) {
            uVar12 = ((uint)*pbVar15 + (uint)*pbVar17 * 0x80) - 0x80;
            if ((char)*pbVar17 < '\0') {
              pVar19 = google::protobuf::internal::VarintParseSlow64((char *)pbVar15,uVar12);
              pbVar15 = (byte *)pVar19.first;
              this->debug_fileoff_ = pVar19.second;
              goto joined_r0x0018f62a;
            }
            uVar9 = (ulong)uVar12;
            pbVar17 = pbVar15 + 2;
          }
          this->debug_fileoff_ = uVar9;
          local_80 = pbVar17;
          goto LAB_0018f667;
        }
        break;
      case 0xd:
        if (cVar11 == 'j') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          psVar7 = (this->source_filter_).ptr_;
          if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
             ) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (local_40,(string *)
                                &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            psVar7 = pAVar5->ptr_;
            pbVar15 = local_80;
          }
          pbVar15 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                      (psVar7,(char *)pbVar15,ctx);
          piVar16 = (internal *)(psVar7->_M_dataplus)._M_p;
          pcVar10 = (char *)psVar7->_M_string_length;
          if ((long)pcVar10 < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig
                      ((size_t)pcVar10,"size_t to int conversion");
          }
          pcVar13 = "bloaty.Options.source_filter";
          goto LAB_0018f61d;
        }
        break;
      case 0xe:
        if (cVar11 == 'p') {
          local_74 = local_74 | 0x20;
          uVar9 = (ulong)(char)*pbVar15;
          pbVar17 = pbVar15 + 1;
          if ((long)uVar9 < 0) {
            uVar12 = ((uint)*pbVar15 + (uint)*pbVar17 * 0x80) - 0x80;
            if ((char)*pbVar17 < '\0') {
              pVar19 = google::protobuf::internal::VarintParseSlow64((char *)pbVar15,uVar12);
              pbVar15 = (byte *)pVar19.first;
              this->dump_raw_map_ = pVar19.second != 0;
              goto joined_r0x0018f62a;
            }
            uVar9 = (ulong)uVar12;
            pbVar17 = pbVar15 + 2;
          }
          this->dump_raw_map_ = uVar9 != 0;
          local_80 = pbVar17;
          goto LAB_0018f667;
        }
        break;
      case 0xf:
        if (cVar11 == 'z') {
          pbVar15 = pbVar15 + -1;
          do {
            local_80 = pbVar15 + 1;
            pRVar8 = (this->source_map_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar8 == (Rep *)0x0) {
              iVar14 = (this->source_map_).super_RepeatedPtrFieldBase.total_size_;
LAB_0018ed60:
              google::protobuf::internal::RepeatedPtrFieldBase::Reserve(local_50,iVar14 + 1);
              pRVar8 = (this->source_map_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = pRVar8->allocated_size;
LAB_0018ed75:
              pRVar8->allocated_size = iVar14 + 1;
              pAVar3 = ((RepeatedPtrFieldBase *)&local_50->arena_)->arena_;
              if (pAVar3 == (Arena *)0x0) {
                psVar7 = (string *)operator_new(0x20);
              }
              else {
                if (pAVar3->hooks_cookie_ != (void *)0x0) {
                  google::protobuf::Arena::OnArenaAllocation
                            (pAVar3,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                }
                psVar7 = (string *)
                         google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                   (&pAVar3->impl_,0x20,
                                    google::protobuf::internal::
                                    arena_destruct_object<std::__cxx11::string>);
              }
              (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
              psVar7->_M_string_length = 0;
              (psVar7->field_2)._M_local_buf[0] = '\0';
              pRVar8 = (this->source_map_).super_RepeatedPtrFieldBase.rep_;
              iVar14 = (this->source_map_).super_RepeatedPtrFieldBase.current_size_;
              pcVar10 = (char *)(long)iVar14;
              (this->source_map_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
              pRVar8->elements[(long)pcVar10] = psVar7;
            }
            else {
              iVar2 = (this->source_map_).super_RepeatedPtrFieldBase.current_size_;
              pcVar10 = (char *)(long)iVar2;
              iVar14 = pRVar8->allocated_size;
              if (iVar14 <= iVar2) {
                if (iVar14 == (this->source_map_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_0018ed60;
                goto LAB_0018ed75;
              }
              (this->source_map_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              psVar7 = (string *)pRVar8->elements[(long)pcVar10];
            }
            pbVar15 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                        (psVar7,(char *)local_80,ctx);
            piVar16 = (internal *)(psVar7->_M_dataplus)._M_p;
            pcVar13 = (char *)psVar7->_M_string_length;
            if ((long)pcVar13 < 0) {
              google::protobuf::StringPiece::LogFatalSizeTooBig
                        ((size_t)pcVar13,"size_t to int conversion");
            }
            str_00.length_ = (stringpiece_ssize_type)"bloaty.Options.source_map";
            str_00.ptr_ = pcVar13;
            google::protobuf::internal::VerifyUTF8(piVar16,str_00,pcVar10);
            if (pbVar15 == (byte *)0x0) goto LAB_0018f755;
            local_80 = pbVar15;
          } while ((pbVar15 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar15 == 0x7a));
          goto LAB_0018f667;
        }
      }
      if ((uVar12 == 0) || ((uVar12 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar12 - 1;
        break;
      }
      pbVar15 = (byte *)google::protobuf::internal::UnknownFieldParse
                                  (uVar12,local_70,(char *)pbVar15,ctx);
joined_r0x0018f62a:
      local_80 = pbVar15;
      if (pbVar15 == (byte *)0x0) goto LAB_0018f755;
LAB_0018f667:
      bVar6 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_80,ctx->group_depth_);
    } while (!bVar6);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | local_74;
  return (char *)local_80;
}

Assistant:

const char* Options::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string filename = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_filename(), ptr, ctx, "bloaty.Options.filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string base_filename = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_base_filename(), ptr, ctx, "bloaty.Options.base_filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string data_source = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_data_source(), ptr, ctx, "bloaty.Options.data_source");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // optional int64 max_rows_per_level = 4 [default = 20];
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_max_rows_per_level(&has_bits);
          max_rows_per_level_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::bloaty::Options_Demangle_IsValid(val))) {
            _internal_set_demangle(static_cast<::bloaty::Options_Demangle>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(5, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::bloaty::Options_SortBy_IsValid(val))) {
            _internal_set_sort_by(static_cast<::bloaty::Options_SortBy>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(6, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional int32 verbose_level = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          _Internal::set_has_verbose_level(&has_bits);
          verbose_level_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .bloaty.CustomDataSource custom_data_source = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_custom_data_source(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string disassemble_function = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_disassemble_function(), ptr, ctx, "bloaty.Options.disassemble_function");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string debug_filename = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_debug_filename(), ptr, ctx, "bloaty.Options.debug_filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      // optional uint64 debug_vmaddr = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 88)) {
          _Internal::set_has_debug_vmaddr(&has_bits);
          debug_vmaddr_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 debug_fileoff = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 96)) {
          _Internal::set_has_debug_fileoff(&has_bits);
          debug_fileoff_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string source_filter = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 106)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_source_filter(), ptr, ctx, "bloaty.Options.source_filter");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool dump_raw_map = 14;
      case 14:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 112)) {
          _Internal::set_has_dump_raw_map(&has_bits);
          dump_raw_map_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string source_map = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_source_map(), ptr, ctx, "bloaty.Options.source_map");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}